

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sortstring.c
# Opt level: O1

void run_cold_5(void)

{
  fwrite("WARNING: --write failed: unable to open file for writing!\n",0x3a,1,_stderr);
  return;
}

Assistant:

static void
write_result(unsigned char **strings, size_t n)
{
	FILE *fp;
	if (!opts.write_filename) {
		const char *username = getenv("USERNAME");
		if (!username)
			username = "";
		if (asprintf(&opts.write_filename, "/tmp/%s/alg.out", username) == -1)
			opts.write_filename = NULL;
	}
	fp = fopen(opts.write_filename, "w");
	if (!fp) {
		fprintf(stderr,
			"WARNING: --write failed: "
			"unable to open file for writing!\n");
		return;
	}
	for (size_t i=0; i < n; ++i) {
		fputs((const char *)strings[i], fp);
		fputc('\n', fp);
	}
	fclose(fp);
	fprintf(stderr, "Wrote sorted output to '%s'.\n",
			opts.write_filename);
	/*
	std::cout << "\n";
	system("md5sum " + opts.write_filename);
	system("cat    " + opts.input_filename + ".md5sum");
	std::cout << "\n";
	*/
}